

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cborencoder.c
# Opt level: O2

CborError encode_number_no_update(CborEncoder *encoder,uint64_t ui,uint8_t shiftedMajorType)

{
  ulong uVar1;
  CborError CVar2;
  long lVar3;
  byte bVar4;
  char cVar5;
  void *data;
  long in_FS_OFFSET;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  data = (void *)((long)&local_10 + 7);
  uVar1 = ui >> 0x38 | (ui & 0xff000000000000) >> 0x28 | (ui & 0xff0000000000) >> 0x18 |
          (ui & 0xff00000000) >> 8 | (ui & 0xff000000) << 8 | (ui & 0xff0000) << 0x18 |
          (ui & 0xff00) << 0x28;
  local_10 = uVar1 | ui << 0x38;
  if (ui < 0x18) {
    bVar4 = (char)ui + shiftedMajorType;
    local_10 = CONCAT17(bVar4,(int7)uVar1);
  }
  else {
    cVar5 = '\x02';
    if (ui < 0x10000) {
      cVar5 = 0xff < ui;
    }
    bVar4 = (cVar5 + '\x01') - (ui >> 0x20 == 0);
    lVar3 = -1L << (bVar4 & 0x3f);
    data = (void *)((long)data + lVar3);
    *(byte *)((long)&local_10 + lVar3 + 7) = shiftedMajorType + bVar4 + '\x18';
  }
  CVar2 = append_to_buffer(encoder,data,(long)&local_8 - (long)data,(uint)bVar4);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return CVar2;
  }
  __stack_chk_fail();
}

Assistant:

static inline CborError encode_number_no_update(CborEncoder *encoder, uint64_t ui, uint8_t shiftedMajorType)
{
    /* Little-endian would have been so much more convenient here:
     * We could just write at the beginning of buf but append_to_buffer
     * only the necessary bytes.
     * Since it has to be big endian, do it the other way around:
     * write from the end. */
    uint64_t buf[2];
    uint8_t *const bufend = (uint8_t *)buf + sizeof(buf);
    uint8_t *bufstart = bufend - 1;
    put64(buf + 1, ui);     /* we probably have a bunch of zeros in the beginning */

    if (ui < Value8Bit) {
        *bufstart += shiftedMajorType;
    } else {
        uint8_t more = 0;
        if (ui > 0xffU)
            ++more;
        if (ui > 0xffffU)
            ++more;
        if (ui > 0xffffffffU)
            ++more;
        bufstart -= (size_t)1 << more;
        *bufstart = shiftedMajorType + Value8Bit + more;
    }

    return append_to_buffer(encoder, bufstart, bufend - bufstart, CborEncoderAppendCborData);
}